

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

ps_latpath_t * ps_astar_next(ps_astar_t *nbest)

{
  ps_lattice_t *ppVar1;
  ps_lattice_t *dag;
  ps_astar_t *nbest_local;
  
  ppVar1 = nbest->dag;
  while( true ) {
    nbest->top = nbest->path_list;
    if (nbest->path_list == (ps_latpath_t *)0x0) {
      return (ps_latpath_t *)0x0;
    }
    nbest->path_list = nbest->path_list->next;
    if (nbest->top == nbest->path_tail) {
      nbest->path_tail = (ps_latpath_t *)0x0;
    }
    nbest->n_path = nbest->n_path + -1;
    if ((nbest->ef <= nbest->top->node->sf) ||
       ((nbest->top->node == ppVar1->end && (ppVar1->end->sf < nbest->ef)))) break;
    if (nbest->top->node->fef < nbest->ef) {
      path_extend(nbest,nbest->top);
    }
  }
  return nbest->top;
}

Assistant:

ps_latpath_t *
ps_astar_next(ps_astar_t *nbest)
{
    ps_lattice_t *dag;

    dag = nbest->dag;

    /* Pop the top (best) partial hypothesis */
    while ((nbest->top = nbest->path_list) != NULL) {
        nbest->path_list = nbest->path_list->next;
        if (nbest->top == nbest->path_tail)
            nbest->path_tail = NULL;
        nbest->n_path--;

        /* Complete hypothesis? */
        if ((nbest->top->node->sf >= nbest->ef)
            || ((nbest->top->node == dag->end) &&
                (nbest->ef > dag->end->sf))) {
            /* FIXME: Verify that it is non-empty.  Also we may want
             * to verify that it is actually distinct from other
             * paths, since often this is not the case*/
            return nbest->top;
        }
        else {
            if (nbest->top->node->fef < nbest->ef)
                path_extend(nbest, nbest->top);
        }
    }

    /* Did not find any more paths to extend. */
    return NULL;
}